

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

QSize __thiscall QDialog::sizeHint(QDialog *this)

{
  int iVar1;
  QDialogPrivate *pQVar2;
  int *piVar3;
  long in_FS_OFFSET;
  QDialogPrivate *d;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_40;
  QSize local_3c;
  int local_34;
  undefined8 local_30;
  int local_28;
  QSize local_24;
  int local_1c;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QDialog *)0x74597a);
  if (pQVar2->extension == (QWidget *)0x0) {
    local_10 = QWidget::sizeHint((QWidget *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  else if (pQVar2->orientation == Horizontal) {
    local_18 = QWidget::sizeHint((QWidget *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    iVar1 = QSize::width((QSize *)0x7459bd);
    local_24 = QWidget::sizeHint((QWidget *)CONCAT44(iVar1,in_stack_ffffffffffffff90));
    local_1c = QSize::height((QSize *)0x7459da);
    local_30 = (**(code **)(*(long *)pQVar2->extension + 0x70))();
    local_28 = QSize::height((QSize *)0x7459ff);
    qMax<int>(&local_1c,&local_28);
    QSize::QSize((QSize *)CONCAT44(iVar1,in_stack_ffffffffffffff90),
                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
  }
  else {
    local_3c = QWidget::sizeHint((QWidget *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_34 = QSize::width((QSize *)0x745a40);
    (**(code **)(*(long *)pQVar2->extension + 0x70))();
    local_40 = QSize::width((QSize *)0x745a65);
    piVar3 = qMax<int>(&local_34,&local_40);
    iVar1 = *piVar3;
    QWidget::sizeHint((QWidget *)CONCAT44(in_stack_ffffffffffffff94,iVar1));
    QSize::height((QSize *)0x745a97);
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff94,iVar1),
                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDialog::sizeHint() const
{
    Q_D(const QDialog);
    if (d->extension) {
        if (d->orientation == Qt::Horizontal)
            return QSize(QWidget::sizeHint().width(),
                        qMax(QWidget::sizeHint().height(),d->extension->sizeHint().height()));
        else
            return QSize(qMax(QWidget::sizeHint().width(), d->extension->sizeHint().width()),
                        QWidget::sizeHint().height());
    }
    return QWidget::sizeHint();
}